

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O2

value_type __thiscall
FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>
::val(FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>
      *this)

{
  value_type vVar1;
  value_type vVar2;
  
  vVar1 = FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>
          ::val(&this->left_->fadexpr_);
  vVar2 = FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>
          ::val(&this->right_->fadexpr_);
  return vVar1 / vVar2;
}

Assistant:

const value_type val() const {return left_.val() / right_.val();}